

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O3

void compress_block(deflate_state *s,ct_data *ltree,ct_data *dtree)

{
  byte bVar1;
  Bytef BVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ushort uVar10;
  uint uVar11;
  ushort uVar12;
  int val;
  uint uVar13;
  ulong uVar14;
  
  if (s->last_lit == 0) {
    iVar9 = s->bi_valid;
  }
  else {
    uVar8 = 0;
    do {
      uVar3 = s->d_buf[uVar8];
      bVar1 = s->l_buf[uVar8];
      if (uVar3 == 0) {
        uVar3 = ltree[bVar1].dl.dad;
        iVar9 = s->bi_valid;
        uVar4 = ltree[bVar1].fc.freq;
        uVar12 = uVar4 << ((byte)iVar9 & 0x1f) | s->bi_buf;
        s->bi_buf = uVar12;
        if ((int)(0x10 - (uint)uVar3) < iVar9) {
          uVar11 = s->pending;
          s->pending = uVar11 + 1;
          s->pending_buf[uVar11] = (Bytef)uVar12;
          BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
          uVar11 = s->pending;
          s->pending = uVar11 + 1;
          s->pending_buf[uVar11] = BVar2;
          s->bi_buf = uVar4 >> (0x10U - (char)s->bi_valid & 0x1f);
          iVar9 = (uint)uVar3 + s->bi_valid + -0x10;
        }
        else {
          iVar9 = iVar9 + (uint)uVar3;
        }
LAB_0058beeb:
        s->bi_valid = iVar9;
      }
      else {
        uVar14 = (ulong)""[bVar1];
        uVar4 = ltree[uVar14 + 0x101].dl.dad;
        iVar9 = s->bi_valid;
        uVar12 = ltree[uVar14 + 0x101].fc.freq;
        uVar10 = uVar12 << ((byte)iVar9 & 0x1f) | s->bi_buf;
        s->bi_buf = uVar10;
        if ((int)(0x10 - (uint)uVar4) < iVar9) {
          uVar11 = s->pending;
          s->pending = uVar11 + 1;
          s->pending_buf[uVar11] = (Bytef)uVar10;
          BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
          uVar11 = s->pending;
          s->pending = uVar11 + 1;
          s->pending_buf[uVar11] = BVar2;
          uVar10 = uVar12 >> (0x10U - (char)s->bi_valid & 0x1f);
          s->bi_buf = uVar10;
          iVar9 = (uint)uVar4 + s->bi_valid + -0x10;
        }
        else {
          iVar9 = iVar9 + (uint)uVar4;
        }
        uVar11 = (uint)uVar10;
        s->bi_valid = iVar9;
        if (0xffffffffffffffeb < uVar14 - 0x1c) {
          iVar5 = extra_lbits[uVar14];
          iVar6 = base_length[uVar14];
          uVar11 = uVar11 | (uint)bVar1 - iVar6 << ((byte)iVar9 & 0x1f);
          s->bi_buf = (ush)uVar11;
          if (0x10 - iVar5 < iVar9) {
            uVar7 = s->pending;
            s->pending = uVar7 + 1;
            s->pending_buf[uVar7] = (Bytef)uVar11;
            BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
            uVar11 = s->pending;
            s->pending = uVar11 + 1;
            s->pending_buf[uVar11] = BVar2;
            uVar11 = ((uint)bVar1 - iVar6 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f);
            s->bi_buf = (ush)uVar11;
            iVar9 = iVar5 + s->bi_valid + -0x10;
          }
          else {
            iVar9 = iVar5 + iVar9;
          }
          s->bi_valid = iVar9;
        }
        uVar13 = uVar3 - 1;
        uVar7 = (uVar13 >> 7) + 0x100;
        if (uVar3 < 0x101) {
          uVar7 = uVar13;
        }
        bVar1 = ""[uVar7];
        uVar3 = dtree[bVar1].dl.dad;
        uVar4 = dtree[bVar1].fc.freq;
        uVar11 = uVar11 | (uint)uVar4 << ((byte)iVar9 & 0x1f);
        s->bi_buf = (ush)uVar11;
        if ((int)(0x10 - (uint)uVar3) < iVar9) {
          uVar7 = s->pending;
          s->pending = uVar7 + 1;
          s->pending_buf[uVar7] = (Bytef)uVar11;
          BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
          uVar11 = s->pending;
          s->pending = uVar11 + 1;
          s->pending_buf[uVar11] = BVar2;
          uVar4 = uVar4 >> (0x10U - (char)s->bi_valid & 0x1f);
          s->bi_buf = uVar4;
          iVar9 = (uint)uVar3 + s->bi_valid + -0x10;
          uVar11 = (uint)uVar4;
        }
        else {
          iVar9 = iVar9 + (uint)uVar3;
        }
        s->bi_valid = iVar9;
        if (3 < bVar1) {
          iVar5 = extra_dbits[bVar1];
          iVar6 = base_dist[bVar1];
          uVar11 = uVar11 | uVar13 - iVar6 << ((byte)iVar9 & 0x1f);
          s->bi_buf = (ush)uVar11;
          if (0x10 - iVar5 < iVar9) {
            uVar7 = s->pending;
            s->pending = uVar7 + 1;
            s->pending_buf[uVar7] = (Bytef)uVar11;
            BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
            uVar11 = s->pending;
            s->pending = uVar11 + 1;
            s->pending_buf[uVar11] = BVar2;
            s->bi_buf = (ush)((uVar13 - iVar6 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
            iVar9 = iVar5 + s->bi_valid + -0x10;
          }
          else {
            iVar9 = iVar5 + iVar9;
          }
          goto LAB_0058beeb;
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < s->last_lit);
  }
  uVar3 = ltree[0x100].dl.dad;
  uVar4 = ltree[0x100].fc.freq;
  uVar12 = uVar4 << ((byte)iVar9 & 0x1f) | s->bi_buf;
  s->bi_buf = uVar12;
  if ((int)(0x10 - (uint)uVar3) < iVar9) {
    uVar11 = s->pending;
    s->pending = uVar11 + 1;
    s->pending_buf[uVar11] = (Bytef)uVar12;
    BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
    uVar11 = s->pending;
    s->pending = uVar11 + 1;
    s->pending_buf[uVar11] = BVar2;
    s->bi_buf = uVar4 >> (0x10U - (char)s->bi_valid & 0x1f);
    iVar9 = (uint)uVar3 + s->bi_valid + -0x10;
  }
  else {
    iVar9 = iVar9 + (uint)uVar3;
  }
  s->bi_valid = iVar9;
  s->last_eob_len = (uint)ltree[0x100].dl.dad;
  return;
}

Assistant:

local void compress_block(s, ltree, dtree)
    deflate_state *s;
    ct_data *ltree; /* literal tree */
    ct_data *dtree; /* distance tree */
{
    unsigned dist;      /* distance of matched string */
    int lc;             /* match length or unmatched char (if dist == 0) */
    unsigned lx = 0;    /* running index in l_buf */
    unsigned code;      /* the code to send */
    int extra;          /* number of extra bits to send */

    if (s->last_lit != 0) do {
        dist = s->d_buf[lx];
        lc = s->l_buf[lx++];
        if (dist == 0) {
            send_code(s, lc, ltree); /* send a literal byte */
            Tracecv(isgraph(lc), (stderr," '%c' ", lc));
        } else {
            /* Here, lc is the match length - MIN_MATCH */
            code = _length_code[lc];
            send_code(s, code+LITERALS+1, ltree); /* send the length code */
            extra = extra_lbits[code];
            if (extra != 0) {
                lc -= base_length[code];
                send_bits(s, lc, extra);       /* send the extra length bits */
            }
            dist--; /* dist is now the match distance - 1 */
            code = d_code(dist);
            Assert (code < D_CODES, "bad d_code");

            send_code(s, code, dtree);       /* send the distance code */
            extra = extra_dbits[code];
            if (extra != 0) {
                dist -= base_dist[code];
                send_bits(s, dist, extra);   /* send the extra distance bits */
            }
        } /* literal or match pair ? */

        /* Check that the overlay between pending_buf and d_buf+l_buf is ok: */
        Assert((uInt)(s->pending) < s->lit_bufsize + 2*lx,
               "pendingBuf overflow");

    } while (lx < s->last_lit);

    send_code(s, END_BLOCK, ltree);
    s->last_eob_len = ltree[END_BLOCK].Len;
}